

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O1

void IDAAhermiteFree(IDAMem IDA_mem)

{
  IDAadjMemRec *pIVar1;
  IDAdtpntMemRec **ppIVar2;
  undefined8 *puVar3;
  long lVar4;
  
  pIVar1 = IDA_mem->ida_adj_mem;
  N_VDestroy(pIVar1->ia_yyTmp);
  N_VDestroy(pIVar1->ia_ypTmp);
  if (pIVar1->ia_storeSensi != 0) {
    N_VDestroyVectorArray(pIVar1->ia_yySTmp,IDA_mem->ida_Ns);
    N_VDestroyVectorArray(pIVar1->ia_ypSTmp,IDA_mem->ida_Ns);
  }
  if (-1 < pIVar1->ia_nsteps) {
    ppIVar2 = pIVar1->dt_mem;
    lVar4 = -1;
    do {
      puVar3 = (undefined8 *)ppIVar2[lVar4 + 1]->content;
      if (puVar3 != (undefined8 *)0x0) {
        N_VDestroy(*puVar3);
        N_VDestroy(puVar3[1]);
        if (pIVar1->ia_storeSensi != 0) {
          N_VDestroyVectorArray(puVar3[2],IDA_mem->ida_Ns);
          N_VDestroyVectorArray(puVar3[3],IDA_mem->ida_Ns);
        }
        free(ppIVar2[lVar4 + 1]->content);
        ppIVar2[lVar4 + 1]->content = (void *)0x0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pIVar1->ia_nsteps);
  }
  return;
}

Assistant:

static void IDAAhermiteFree(IDAMem IDA_mem)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDAhermiteDataMem content;
  long int i;

  IDAADJ_mem = IDA_mem->ida_adj_mem;

  N_VDestroy(IDAADJ_mem->ia_yyTmp);
  N_VDestroy(IDAADJ_mem->ia_ypTmp);

  if (IDAADJ_mem->ia_storeSensi)
  {
    N_VDestroyVectorArray(IDAADJ_mem->ia_yySTmp, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDAADJ_mem->ia_ypSTmp, IDA_mem->ida_Ns);
  }

  dt_mem = IDAADJ_mem->dt_mem;

  for (i = 0; i <= IDAADJ_mem->ia_nsteps; i++)
  {
    content = (IDAhermiteDataMem)(dt_mem[i]->content);
    /* content might be NULL, if IDAAdjInit was called but IDASolveF was not. */
    if (content)
    {
      N_VDestroy(content->y);
      N_VDestroy(content->yd);

      if (IDAADJ_mem->ia_storeSensi)
      {
        N_VDestroyVectorArray(content->yS, IDA_mem->ida_Ns);
        N_VDestroyVectorArray(content->ySd, IDA_mem->ida_Ns);
      }
      free(dt_mem[i]->content);
      dt_mem[i]->content = NULL;
    }
  }
}